

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O2

void __thiscall CoreML::ShapeRange::ShapeRange(ShapeRange *this,RangeValue *min,RangeValue *max)

{
  size_t sVar1;
  undefined7 uVar2;
  bool bVar3;
  ostream *poVar4;
  runtime_error *prVar5;
  string asStack_1c8 [32];
  stringstream ss;
  ostream local_198 [376];
  
  uVar2 = *(undefined7 *)&min->field_0x1;
  sVar1 = min->_val;
  (this->_minimum)._isUnbound = min->_isUnbound;
  *(undefined7 *)&(this->_minimum).field_0x1 = uVar2;
  (this->_minimum)._val = sVar1;
  uVar2 = *(undefined7 *)&max->field_0x1;
  sVar1 = max->_val;
  (this->_maximum)._isUnbound = max->_isUnbound;
  *(undefined7 *)&(this->_maximum).field_0x1 = uVar2;
  (this->_maximum)._val = sVar1;
  bVar3 = RangeValue::operator>(min,max);
  if (bVar3) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar4 = std::operator<<(local_198,"Constructing invalid ShapeRange with ");
    ::operator<<(poVar4,min);
    poVar4 = std::operator<<(poVar4,", ");
    ::operator<<(poVar4,max);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,asStack_1c8);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (min->_isUnbound != true) {
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  std::operator<<(local_198,"Constructing invalid ShapeRange unbound minimum value.");
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar5,asStack_1c8);
  __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

ShapeRange::ShapeRange(const RangeValue& min, const RangeValue& max)
:
_minimum(min),
_maximum(max)
{
    if (min > max)
    {
        std::stringstream ss;
        ss << "Constructing invalid ShapeRange with " << min << ", " << max;
        throw std::runtime_error(ss.str());
    }
    if (min.isUnbound()) {
        std::stringstream ss;
        ss << "Constructing invalid ShapeRange unbound minimum value.";
        throw std::runtime_error(ss.str());
    }
}